

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CacheOperators.cpp
# Opt level: O0

void Js::CacheOperators::TraceCacheCommon
               (char16 *methodName,PropertyId propertyId,ScriptContext *requestContext,
               RecyclableObject *object)

{
  char16 *pcVar1;
  BOOL BVar2;
  FunctionBody *this;
  PropertyRecord *this_00;
  char16 *pcVar3;
  Type *pTVar4;
  FunctionBody *functionBody;
  uint columnNumber;
  uint lineNumber;
  WCHAR *callerName;
  JavascriptFunction *caller;
  RecyclableObject *object_local;
  ScriptContext *requestContext_local;
  char16 *pcStack_10;
  PropertyId propertyId_local;
  char16 *methodName_local;
  
  if (object != (RecyclableObject *)0x0) {
    _columnNumber = (char16 *)0x0;
    functionBody._4_4_ = 0;
    functionBody._0_4_ = 0;
    caller = (JavascriptFunction *)object;
    object_local = (RecyclableObject *)requestContext;
    requestContext_local._4_4_ = propertyId;
    pcStack_10 = methodName;
    BVar2 = JavascriptStackWalker::GetCaller((JavascriptFunction **)&callerName,requestContext);
    if (BVar2 != 0) {
      this = JavascriptFunction::GetFunctionBody((JavascriptFunction *)callerName);
      _columnNumber =
           ParseableFunctionInfo::GetExternalDisplayName(&this->super_ParseableFunctionInfo);
      functionBody._4_4_ = ParseableFunctionInfo::GetLineNumber(&this->super_ParseableFunctionInfo);
      functionBody._0_4_ =
           ParseableFunctionInfo::GetColumnNumber(&this->super_ParseableFunctionInfo);
    }
    pcVar1 = pcStack_10;
    this_00 = ScriptContext::GetPropertyName
                        ((ScriptContext *)object_local,requestContext_local._4_4_);
    pcVar3 = PropertyRecord::GetBuffer(this_00);
    pTVar4 = RecyclableObject::GetType((RecyclableObject *)caller);
    Output::Print(L"%s, %s, %s(%d:%d), InType: 0x%X ",pcVar1,pcVar3,_columnNumber,
                  (ulong)functionBody._4_4_,(ulong)(ULONG)functionBody,pTVar4);
  }
  return;
}

Assistant:

void CacheOperators::TraceCacheCommon(const char16 * methodName, PropertyId propertyId, ScriptContext * requestContext, RecyclableObject * object)
    {
        if(object)
        {
            JavascriptFunction* caller;
            const WCHAR* callerName = NULL;
            uint lineNumber = 0;
            uint columnNumber = 0;
            if(JavascriptStackWalker::GetCaller(&caller, requestContext))
            {
                FunctionBody *functionBody = caller->GetFunctionBody();
                callerName = functionBody->GetExternalDisplayName();
                lineNumber = functionBody->GetLineNumber();
                columnNumber = functionBody->GetColumnNumber();
            }
            Output::Print(_u("%s, %s, %s(%d:%d), InType: 0x%X "),
                methodName,
                requestContext->GetPropertyName(propertyId)->GetBuffer(),
                callerName,
                lineNumber,
                columnNumber,
                object->GetType());
        }
    }